

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicAllTargetsLoadFS::Run(BasicAllTargetsLoadFS *this)

{
  bool bVar1;
  Vector<unsigned_int,_4> local_198;
  Vector<unsigned_int,_4> local_188;
  Vector<int,_4> local_178;
  Vector<int,_4> local_168;
  Vector<float,_4> local_158;
  Vector<float,_4> local_148;
  Vector<unsigned_int,_4> local_138;
  Vector<unsigned_int,_4> local_128;
  Vector<int,_4> local_118;
  Vector<int,_4> local_108;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vector<unsigned_int,_4> local_d8;
  Vector<unsigned_int,_4> local_c8;
  Vector<int,_4> local_b8;
  Vector<int,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<unsigned_int,_4> local_78;
  Vector<unsigned_int,_4> local_68;
  Vector<int,_4> local_58;
  Vector<int,_4> local_48;
  Vector<float,_4> local_38;
  Vector<float,_4> local_28;
  BasicAllTargetsLoadFS *local_18;
  BasicAllTargetsLoadFS *this_local;
  
  local_18 = this;
  bVar1 = ShaderImageLoadStoreBase::IsVSFSAvailable(&this->super_ShaderImageLoadStoreBase,0,4);
  if ((bVar1) &&
     (bVar1 = ShaderImageLoadStoreBase::IsSSBInVSFSAvailable
                        (&this->super_ShaderImageLoadStoreBase,4), bVar1)) {
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
    tcu::Vector<float,_4>::Vector(&local_28,-1.0,10.0,-200.0,3000.0);
    tcu::Vector<float,_4>::Vector(&local_38,-1.0,10.0,-200.0,3000.0);
    bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::Read<tcu::Vector<float,4>>
                      ((BasicAllTargetsLoadFS *)this,0,0x8814,&local_28,&local_38,0x1908,0x1406);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<int,_4>::Vector(&local_48,-1,10,-200,3000);
      tcu::Vector<int,_4>::Vector(&local_58,-1,10,-200,3000);
      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::Read<tcu::Vector<int,4>>
                        ((BasicAllTargetsLoadFS *)this,0,0x8d82,&local_48,&local_58,0x8d99,0x1404);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<unsigned_int,_4>::Vector(&local_68,1,10,200,3000);
        tcu::Vector<unsigned_int,_4>::Vector(&local_78,1,10,200,3000);
        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                Read<tcu::Vector<unsigned_int,4>>
                          ((BasicAllTargetsLoadFS *)this,0,0x8d70,&local_68,&local_78,0x8d99,0x1405)
        ;
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<float,_4>::Vector(&local_88,-1.0,10.0,-200.0,3000.0);
          tcu::Vector<float,_4>::Vector(&local_98,-1.0,10.0,-200.0,3000.0);
          bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::Read<tcu::Vector<float,4>>
                            ((BasicAllTargetsLoadFS *)this,1,0x8814,&local_88,&local_98,0x1908,
                             0x1406);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<int,_4>::Vector(&local_a8,-1,10,-200,3000);
            tcu::Vector<int,_4>::Vector(&local_b8,-1,10,-200,3000);
            bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::Read<tcu::Vector<int,4>>
                              ((BasicAllTargetsLoadFS *)this,1,0x8d82,&local_a8,&local_b8,0x8d99,
                               0x1404);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              tcu::Vector<unsigned_int,_4>::Vector(&local_c8,1,10,200,3000);
              tcu::Vector<unsigned_int,_4>::Vector(&local_d8,1,10,200,3000);
              bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                      Read<tcu::Vector<unsigned_int,4>>
                                ((BasicAllTargetsLoadFS *)this,1,0x8d70,&local_c8,&local_d8,0x8d99,
                                 0x1405);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                tcu::Vector<float,_4>::Vector(&local_e8,-1.0,10.0,-200.0,3000.0);
                tcu::Vector<float,_4>::Vector(&local_f8,-1.0,10.0,-200.0,3000.0);
                bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                        Read<tcu::Vector<float,4>>
                                  ((BasicAllTargetsLoadFS *)this,2,0x8814,&local_e8,&local_f8,0x1908
                                   ,0x1406);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  tcu::Vector<int,_4>::Vector(&local_108,-1,10,-200,3000);
                  tcu::Vector<int,_4>::Vector(&local_118,-1,10,-200,3000);
                  bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                          Read<tcu::Vector<int,4>>
                                    ((BasicAllTargetsLoadFS *)this,2,0x8d82,&local_108,&local_118,
                                     0x8d99,0x1404);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    tcu::Vector<unsigned_int,_4>::Vector(&local_128,1,10,200,3000);
                    tcu::Vector<unsigned_int,_4>::Vector(&local_138,1,10,200,3000);
                    bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                            Read<tcu::Vector<unsigned_int,4>>
                                      ((BasicAllTargetsLoadFS *)this,2,0x8d70,&local_128,&local_138,
                                       0x8d99,0x1405);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      tcu::Vector<float,_4>::Vector(&local_148,-1.0,10.0,-200.0,3000.0);
                      tcu::Vector<float,_4>::Vector(&local_158,-1.0,10.0,-200.0,3000.0);
                      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                              Read<tcu::Vector<float,4>>
                                        ((BasicAllTargetsLoadFS *)this,3,0x8814,&local_148,
                                         &local_158,0x1908,0x1406);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        tcu::Vector<int,_4>::Vector(&local_168,-1,10,-200,3000);
                        tcu::Vector<int,_4>::Vector(&local_178,-1,10,-200,3000);
                        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                                Read<tcu::Vector<int,4>>
                                          ((BasicAllTargetsLoadFS *)this,3,0x8d82,&local_168,
                                           &local_178,0x8d99,0x1404);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          tcu::Vector<unsigned_int,_4>::Vector(&local_188,1,10,200,3000);
                          tcu::Vector<unsigned_int,_4>::Vector(&local_198,1,10,200,3000);
                          bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                                  Read<tcu::Vector<unsigned_int,4>>
                                            ((BasicAllTargetsLoadFS *)this,3,0x8d70,&local_188,
                                             &local_198,0x8d99,0x1405);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            this_local = (BasicAllTargetsLoadFS *)0x0;
                          }
                          else {
                            this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicAllTargetsLoadFS *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicAllTargetsLoadFS *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(0, 4) || !IsSSBInVSFSAvailable(4))
			return NOT_SUPPORTED;
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Read(T2D, GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f), GL_RGBA,
				  GL_FLOAT))
			return ERROR;
		if (!Read(T2D, GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(T2D, GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000), GL_RGBA_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(T3D, GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f), GL_RGBA,
				  GL_FLOAT))
			return ERROR;
		if (!Read(T3D, GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(T3D, GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000), GL_RGBA_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(TCM, GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f), GL_RGBA,
				  GL_FLOAT))
			return ERROR;
		if (!Read(TCM, GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(TCM, GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000), GL_RGBA_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(T2DA, GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f), GL_RGBA,
				  GL_FLOAT))
			return ERROR;
		if (!Read(T2DA, GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(T2DA, GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000), GL_RGBA_INTEGER,
				  GL_UNSIGNED_INT))
			return ERROR;

		return NO_ERROR;
	}